

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O0

archive_read_filter * get_filter(archive *_a,int n)

{
  archive_read_filter *local_38;
  archive_read_filter *last;
  archive_read_filter *f;
  archive_read *a;
  int n_local;
  archive *_a_local;
  
  local_38 = (archive_read_filter *)_a[6].error_string.length;
  if ((n == -1) && (local_38 != (archive_read_filter *)0x0)) {
    for (last = local_38->upstream; last != (archive_read_filter *)0x0; last = last->upstream) {
      local_38 = last;
    }
    _a_local = (archive *)local_38;
  }
  else {
    last = local_38;
    a._4_4_ = n;
    if (n < 0) {
      _a_local = (archive *)0x0;
    }
    else {
      for (; 0 < a._4_4_ && last != (archive_read_filter *)0x0; a._4_4_ = a._4_4_ + -1) {
        last = last->upstream;
      }
      _a_local = (archive *)last;
    }
  }
  return (archive_read_filter *)_a_local;
}

Assistant:

static struct archive_read_filter *
get_filter(struct archive *_a, int n)
{
	struct archive_read *a = (struct archive_read *)_a;
	struct archive_read_filter *f = a->filter;
	/* We use n == -1 for 'the last filter', which is always the
	 * client proxy. */
	if (n == -1 && f != NULL) {
		struct archive_read_filter *last = f;
		f = f->upstream;
		while (f != NULL) {
			last = f;
			f = f->upstream;
		}
		return (last);
	}
	if (n < 0)
		return NULL;
	while (n > 0 && f != NULL) {
		f = f->upstream;
		--n;
	}
	return (f);
}